

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Bool prvTidyFindNodeWithId(Node *node,TidyTagId tid)

{
  Bool BVar1;
  Node *local_28;
  Node *content;
  Node *pNStack_18;
  TidyTagId tid_local;
  Node *node_local;
  
  pNStack_18 = node;
  while( true ) {
    if (pNStack_18 == (Node *)0x0) {
      return no;
    }
    if (((pNStack_18 != (Node *)0x0) && (pNStack_18->tag != (Dict *)0x0)) &&
       (pNStack_18->tag->id == tid)) break;
    for (local_28 = pNStack_18->content; local_28 != (Node *)0x0; local_28 = local_28->content) {
      BVar1 = prvTidyFindNodeWithId(local_28,tid);
      if (BVar1 != no) {
        return yes;
      }
    }
    pNStack_18 = pNStack_18->next;
  }
  return yes;
}

Assistant:

Bool TY_(FindNodeWithId)( Node *node, TidyTagId tid )
{
    Node *content;
    while (node)
    {
        if (TagIsId(node,tid))
            return yes;
        for (content = node->content; content; content = content->content)
        {
            if (TY_(FindNodeWithId)(content,tid))
                return yes;
        }
        node = node->next;
    }
    return no;
}